

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

ALLEGRO_COLOR al_get_bitmap_blend_color(void)

{
  ALLEGRO_BITMAP *pAVar1;
  ALLEGRO_BLENDER *b;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_COLOR local_10;
  
  pAVar1 = al_get_target_bitmap();
  if ((pAVar1->use_bitmap_blender & 1U) == 0) {
    local_10 = al_get_blend_color();
  }
  else {
    local_10 = (pAVar1->blender).blend_color;
  }
  return local_10;
}

Assistant:

ALLEGRO_COLOR al_get_bitmap_blend_color(void)
{
   ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();
   ALLEGRO_BLENDER *b;

   ASSERT(bitmap);

   if (!bitmap->use_bitmap_blender) {
      /* If no bitmap blender set, use TLS */
      return al_get_blend_color();
   }
   
   b = &bitmap->blender;
   return b->blend_color;
}